

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRewrite.c
# Opt level: O2

void Abc_ManRewritePrintDivs(Vec_Ptr_t *vDivs,int nLeaves)

{
  long *plVar1;
  ulong uVar2;
  long *plVar3;
  void *pvVar4;
  char *pcVar5;
  uint i;
  uint i_00;
  int i_01;
  
  uVar2 = (ulong)vDivs->nSize;
  if ((long)uVar2 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
  }
  plVar1 = (long *)vDivs->pArray[uVar2 - 1];
  i = 0;
  do {
    if ((int)uVar2 <= (int)i) {
      putchar(10);
      return;
    }
    plVar3 = (long *)Vec_PtrEntry(vDivs,i);
    if ((int)i < nLeaves) {
      printf("%6d : %c\n",(ulong)*(uint *)(plVar3 + 2),(ulong)(i + 0x61));
    }
    else {
      printf("%6d : %2d = ",(ulong)*(uint *)(plVar3 + 2),(ulong)i);
      for (i_00 = 0; (int)i_00 < vDivs->nSize; i_00 = i_00 + 1) {
        pvVar4 = Vec_PtrEntry(vDivs,i_00);
        if (*(void **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8) ==
            pvVar4) break;
      }
      if ((int)i_00 < nLeaves) {
        putchar(i_00 + 0x61);
      }
      else {
        printf("%d",(ulong)i_00);
      }
      pcVar5 = "\'";
      if ((*(uint *)((long)plVar3 + 0x14) >> 10 & 1) == 0) {
        pcVar5 = "";
      }
      printf("%s ",pcVar5);
      uVar2 = 0;
      while (i_01 = (int)uVar2, i_01 < vDivs->nSize) {
        pvVar4 = Vec_PtrEntry(vDivs,i_01);
        if (*(void **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)(plVar3[4] + 4) * 8)
            == pvVar4) break;
        uVar2 = (ulong)(i_01 + 1);
      }
      if (i_01 < nLeaves) {
        putchar(i_01 + 0x61);
      }
      else {
        printf("%d",uVar2);
      }
      pcVar5 = "\'";
      if ((*(uint *)((long)plVar3 + 0x14) >> 0xb & 1) == 0) {
        pcVar5 = "";
      }
      printf("%s ",pcVar5);
      if (plVar3 == plVar1) {
        printf(" root");
      }
      putchar(10);
    }
    i = i + 1;
    uVar2 = (ulong)(uint)vDivs->nSize;
  } while( true );
}

Assistant:

void Abc_ManRewritePrintDivs( Vec_Ptr_t * vDivs, int nLeaves )
{
    Abc_Obj_t * pFanin, * pNode, * pRoot;
    int i, k;
    pRoot = (Abc_Obj_t *)Vec_PtrEntryLast(vDivs);
    // print the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vDivs, pNode, i )
    {
        if ( i < nLeaves )
        {
            printf( "%6d : %c\n", pNode->Id, 'a'+i );
            continue;
        }
        printf( "%6d : %2d = ", pNode->Id, i );
        // find the first fanin
        Vec_PtrForEachEntry( Abc_Obj_t *, vDivs, pFanin, k )
            if ( Abc_ObjFanin0(pNode) == pFanin )
                break;
        if ( k < nLeaves )
            printf( "%c", 'a' + k );
        else
            printf( "%d", k );
        printf( "%s ", Abc_ObjFaninC0(pNode)? "\'" : "" );
        // find the second fanin
        Vec_PtrForEachEntry( Abc_Obj_t *, vDivs, pFanin, k )
            if ( Abc_ObjFanin1(pNode) == pFanin )
                break;
        if ( k < nLeaves )
            printf( "%c", 'a' + k );
        else
            printf( "%d", k );
        printf( "%s ", Abc_ObjFaninC1(pNode)? "\'" : "" );
        if ( pNode == pRoot )
            printf( " root" );
        printf( "\n" );
    }
    printf( "\n" );
}